

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O2

int run_test_loop_backend_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_b0;
  uv_timer_t timer;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  if (iVar1 == 0) {
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) {
      iVar1 = uv_backend_timeout(uVar2);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,cb,1000,0);
        if (iVar1 == 0) {
          iVar1 = uv_backend_timeout(uVar2);
          if (iVar1 < 0x65) {
            pcVar3 = "uv_backend_timeout(loop) > 100";
            uStack_b0 = 0x36;
          }
          else {
            iVar1 = uv_backend_timeout(uVar2);
            if (iVar1 < 0x3e9) {
              iVar1 = uv_run(uVar2,0);
              if (iVar1 == 0) {
                iVar1 = uv_backend_timeout(uVar2);
                if (iVar1 == 0) {
                  loop = (uv_loop_t *)uv_default_loop();
                  close_loop(loop);
                  uVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                  uStack_b0 = 0x3d;
                }
                else {
                  pcVar3 = "uv_backend_timeout(loop) == 0";
                  uStack_b0 = 0x3b;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_b0 = 0x3a;
              }
            }
            else {
              pcVar3 = "uv_backend_timeout(loop) <= 1000";
              uStack_b0 = 0x37;
            }
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_b0 = 0x35;
        }
      }
      else {
        pcVar3 = "uv_backend_timeout(loop) == 0";
        uStack_b0 = 0x32;
      }
    }
    else {
      pcVar3 = "!uv_loop_alive(loop)";
      uStack_b0 = 0x31;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_b0 = 0x2f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
          ,uStack_b0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(loop_backend_timeout) {
  uv_loop_t *loop = uv_default_loop();
  uv_timer_t timer;
  int r;

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  ASSERT(!uv_loop_alive(loop));
  ASSERT(uv_backend_timeout(loop) == 0);

  r = uv_timer_start(&timer, cb, 1000, 0); /* 1 sec */
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) > 100); /* 0.1 sec */
  ASSERT(uv_backend_timeout(loop) <= 1000); /* 1 sec */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}